

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O0

bool spdlog::details::os::fwrite_bytes(void *ptr,size_t n_bytes,FILE *fp)

{
  size_t sVar1;
  FILE *in_RDX;
  size_t in_RSI;
  void *in_RDI;
  
  sVar1 = fwrite_unlocked(in_RDI,1,in_RSI,in_RDX);
  return sVar1 == in_RSI;
}

Assistant:

SPDLOG_INLINE bool fwrite_bytes(const void *ptr, const size_t n_bytes, FILE *fp) {
    #if defined(_WIN32) && defined(SPDLOG_FWRITE_UNLOCKED)
    return _fwrite_nolock(ptr, 1, n_bytes, fp) == n_bytes;
    #elif defined(SPDLOG_FWRITE_UNLOCKED)
    return ::fwrite_unlocked(ptr, 1, n_bytes, fp) == n_bytes;
    #else
    return std::fwrite(ptr, 1, n_bytes, fp) == n_bytes;
    #endif
}